

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O2

int comex_getv(comex_giov_t *iov,int iov_len,int proc,comex_group_t group)

{
  int bytes;
  void **ppvVar1;
  void **ppvVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)iov_len;
  if (iov_len < 1) {
    uVar6 = 0;
  }
  for (uVar4 = 0; uVar4 != uVar6; uVar4 = uVar4 + 1) {
    ppvVar1 = iov[uVar4].src;
    ppvVar2 = iov[uVar4].dst;
    bytes = iov[uVar4].bytes;
    uVar3 = iov[uVar4].count;
    if (iov[uVar4].count < 1) {
      uVar3 = 0;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      comex_get(ppvVar1[uVar5],ppvVar2[uVar5],bytes,proc,group);
    }
  }
  return 0;
}

Assistant:

int comex_getv(
        comex_giov_t *iov, int iov_len,
        int proc, comex_group_t group)
{
    int i;
    for (i=0; i<iov_len; ++i) {
        int j;
        void **src = iov[i].src;
        void **dst = iov[i].dst;
        int bytes = iov[i].bytes;
        int count = iov[i].count;
        for (j=0; j<count; ++j) {
            comex_get(src[j], dst[j], bytes, proc, group);
        }
    }
    return COMEX_SUCCESS;
}